

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O0

string_view
absl::anon_unknown_5::GenericFind<absl::(anonymous_namespace)::AnyOfPolicy>
          (size_t param_1,char *param_2,size_t param_3,char *param_4,long param_5)

{
  string_view delimiter;
  string_view sVar1;
  string_view text;
  string_view sVar2;
  bool bVar3;
  const_pointer pvVar4;
  size_type sVar5;
  size_t sVar6;
  size_t __len;
  size_t found_pos;
  string_view found;
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_30._M_len = param_3;
  local_30._M_str = param_4;
  local_20._M_len = param_1;
  local_20._M_str = param_2;
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_30);
  if ((bVar3) &&
     (sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_20), sVar5 != 0))
  {
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_10,pvVar4 + param_5 + 1,0);
  }
  else {
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_20);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_10,pvVar4 + sVar5,0);
    text._M_str = in_stack_ffffffffffffff90;
    text._M_len = in_stack_ffffffffffffff88;
    delimiter._M_str = in_stack_ffffffffffffff80;
    delimiter._M_len = in_stack_ffffffffffffff78;
    sVar6 = AnyOfPolicy::Find(text,delimiter,(size_t)pvVar4);
    if (sVar6 != 0xffffffffffffffff) {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_20);
      sVar1._M_str = local_30._M_str;
      sVar1._M_len = local_30._M_len;
      __len = AnyOfPolicy::Length(sVar1);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff88,
                 pvVar4 + sVar6,__len);
      local_10._M_len = in_stack_ffffffffffffff88;
      local_10._M_str = in_stack_ffffffffffffff90;
    }
  }
  sVar2._M_str = local_10._M_str;
  sVar2._M_len = local_10._M_len;
  return sVar2;
}

Assistant:

absl::string_view GenericFind(absl::string_view text,
                              absl::string_view delimiter, size_t pos,
                              FindPolicy find_policy) {
  if (delimiter.empty() && text.length() > 0) {
    // Special case for empty string delimiters: always return a zero-length
    // absl::string_view referring to the item at position 1 past pos.
    return absl::string_view(text.data() + pos + 1, 0);
  }
  size_t found_pos = absl::string_view::npos;
  absl::string_view found(text.data() + text.size(),
                          0);  // By default, not found
  found_pos = find_policy.Find(text, delimiter, pos);
  if (found_pos != absl::string_view::npos) {
    found = absl::string_view(text.data() + found_pos,
                              find_policy.Length(delimiter));
  }
  return found;
}